

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O3

uint32_t *
FastPForLib::SIMDFastPFor<8u>::
unpackmesimd<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
          (uint32_t *in,
          vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_> *out,
          uint32_t bit)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  uint uVar5;
  __m128i *in_00;
  uint uVar6;
  uint uVar7;
  uint32_t *in_01;
  int iVar8;
  uint32_t buffer [32];
  uint32_t local_b8 [34];
  
  uVar1 = *in;
  in_00 = (__m128i *)(in + 1);
  std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::resize
            (out,(ulong)(uVar1 + 0x1f & 0xffffffe0));
  uVar6 = 0;
  if (0x7f < (ulong)uVar1) {
    uVar4 = 0;
    do {
      iVar8 = (int)uVar4;
      usimdunpack(in_00,(out->
                        super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar4,bit);
      in_00 = (__m128i *)((long)*in_00 + (ulong)(bit * 4) * 4);
      uVar6 = iVar8 + 0x80;
      uVar4 = (ulong)uVar6;
    } while (iVar8 + 0x100U <= uVar1);
  }
  uVar4 = (ulong)bit;
  if ((uVar6 | 0x1f) < uVar1) {
    uVar5 = uVar6;
    do {
      fastunpack((uint32_t *)in_00,
                 (out->
                 super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar5,bit);
      uVar6 = uVar5 + 0x20;
      in_00 = (__m128i *)((long)*in_00 + uVar4 * 4);
      uVar7 = uVar5 + 0x3f;
      uVar5 = uVar6;
    } while (uVar7 < uVar1);
  }
  in_01 = local_b8;
  memcpy(in_01,in_00,(ulong)((uVar1 - uVar6) * bit + 0x1f >> 3 & 0xfffffffc));
  puVar2 = (out->
           super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = (out->
           super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (uVar5 = uVar6; uVar5 < uVar1; uVar5 = uVar5 + 0x20) {
    fastunpack(in_01,(out->
                     super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar5,bit);
    in_01 = in_01 + uVar4;
  }
  std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>::resize
            (out,(ulong)uVar1);
  return (uint32_t *)
         ((long)in_00 +
         ((((long)puVar3 - (long)puVar2 >> 2) - (ulong)uVar6 >> 5) * uVar4 * 4 -
         (ulong)(((uVar5 - uVar1) * bit >> 5) << 2)));
}

Assistant:

static const uint32_t *unpackmesimd(const uint32_t *in, STLContainer &out,
                                      const uint32_t bit) {
    const uint32_t size = *in;
    ++in;
    out.resize((size + 32 - 1) / 32 * 32);
    uint32_t j = 0;
    for (; j + 128 <= size; j += 128) {
      usimdunpack(reinterpret_cast<const __m128i *>(in), &out[j], bit);
      in += 4 * bit;
    }
    for (; j + 31 < size; j += 32) {
      fastunpack(in, &out[j], bit);
      in += bit;
    }
    uint32_t buffer[PACKSIZE];
    uint32_t remaining = size - j;
    memcpy(buffer, in, (remaining * bit + 31) / 32 * sizeof(uint32_t));
    uint32_t *bpointer = buffer;
    in += (out.size() - j) / 32 * bit;
    for (; j < size; j += 32) {
      fastunpack(bpointer, &out[j], bit);
      bpointer += bit;
    }
    in -= (j - size) * bit / 32;
    out.resize(size);
    return in;
  }